

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

void __thiscall
BayesianGameWithClusterInfo::ShiftProbabilityAndUtility
          (BayesianGameWithClusterInfo *this,Index agI,Index t1,Index t2)

{
  Index IVar1;
  Index IVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  BayesianGameBase *pBVar3;
  value_type in_ECX;
  int in_EDX;
  long in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Index jaI;
  Index jtI2;
  Index jtI1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIndices2;
  bool finished;
  double u2;
  double u1;
  double p2;
  double p1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIndices;
  Index in_stack_fffffffffffffee8;
  Index in_stack_fffffffffffffeec;
  BayesianGameIdenticalPayoff *in_stack_fffffffffffffef0;
  allocator_type *in_stack_fffffffffffffef8;
  BayesianGameBase *in_stack_ffffffffffffff00;
  size_type in_stack_ffffffffffffff08;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff20;
  Index in_stack_ffffffffffffff24;
  Index in_stack_ffffffffffffff28;
  value_type in_stack_ffffffffffffff2c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint local_a4;
  bool local_7a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_79;
  BayesianGameIdenticalPayoff *local_50;
  ulong local_48;
  double local_40;
  double local_38;
  value_type local_14;
  int local_10;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8c062e);
  local_40 = 0.0;
  local_50 = (BayesianGameIdenticalPayoff *)0x0;
  (**(code **)(*(long *)(in_RDI + 0x20) + 0x18))(in_RDI + 0x20);
  local_79.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._1_4_ = 0;
  this_00 = &local_79;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8c0680);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (value_type_conflict1 *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffef8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff00);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8c06d0);
  local_7a = false;
  while (((local_7a ^ 0xffU) & 1) != 0) {
    __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffef0,
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (*(int *)&(__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start == local_10) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_00,__x);
      in_stack_ffffffffffffff2c = local_14;
      pBVar3 = (BayesianGameBase *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_fffffffffffffef0,
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      *(value_type *)
       &(pBVar3->super_Interface_ProblemToPolicyDiscretePure).
        super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
           in_stack_ffffffffffffff2c;
      IVar1 = BayesianGameBase::IndividualToJointTypeIndices
                        ((BayesianGameBase *)in_stack_fffffffffffffef0,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      in_stack_ffffffffffffff28 = IVar1;
      IVar2 = BayesianGameBase::IndividualToJointTypeIndices
                        ((BayesianGameBase *)in_stack_fffffffffffffef0,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      in_stack_ffffffffffffff24 = IVar2;
      local_38 = (double)(**(code **)(*(long *)(in_RDI + 0x20) + 0x68))(in_RDI + 0x20,IVar1);
      local_40 = (double)(**(code **)(*(long *)(in_RDI + 0x20) + 0x68))(in_RDI + 0x20,IVar2);
      BayesianGameBase::SetProbability
                (pBVar3,in_stack_ffffffffffffff2c,
                 (double)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      BayesianGameBase::SetProbability
                (pBVar3,in_stack_ffffffffffffff2c,
                 (double)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      if (*(int *)(in_RDI + 0x1b0) != 0) {
        local_a4 = 0;
        while( true ) {
          in_stack_ffffffffffffff00 = (BayesianGameBase *)(ulong)local_a4;
          pBVar3 = (BayesianGameBase *)
                   BayesianGameBase::GetNrJointActions(in_stack_ffffffffffffff00);
          if (pBVar3 <= in_stack_ffffffffffffff00) break;
          local_48 = (**(code **)(*(long *)(in_RDI + 0x20) + 0x80))(in_RDI + 0x20,IVar1,local_a4);
          in_stack_fffffffffffffef0 =
               (BayesianGameIdenticalPayoff *)
               (**(code **)(*(long *)(in_RDI + 0x20) + 0x80))(in_RDI + 0x20,IVar2,local_a4);
          auVar5._0_8_ = local_38 / (local_38 + local_40);
          auVar5._8_8_ = 0;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_48;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = (local_40 / (local_38 + local_40)) * (double)in_stack_fffffffffffffef0;
          vfmadd213sd_fma(auVar4,auVar5,auVar6);
          local_50 = in_stack_fffffffffffffef0;
          BayesianGameIdenticalPayoff::SetUtility
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                     4.53425535044106e-317);
          local_a4 = local_a4 + 1;
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff00);
    }
    local_7a = IndexTools::Increment
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    in_stack_fffffffffffffeec = CONCAT13(local_7a,(int3)in_stack_fffffffffffffeec);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff00);
  return;
}

Assistant:

void BayesianGameWithClusterInfo::ShiftProbabilityAndUtility(Index agI, Index t1, Index t2)
{
    

    //add the probability mass of the joint types in which
    //t2 participates to the corresponding joint types
    //of t1.
    vector<Index> typeIndices;
    //first we compute the marginals P(t1) and P(t2)
    double p1, p2 = 0.0;
    double u1, u2 = 0;
    typeIndices = vector<Index>(GetNrAgents(), 0 );
    bool finished = false;
    while( !finished )
    {
        //only if agent agI's component is t1 we do stuff
        if(typeIndices.at(agI) == t1)
        {
            vector<Index> typeIndices2 = typeIndices;
            typeIndices2.at(agI) = t2;
            Index jtI1 = IndividualToJointTypeIndices( 
                    typeIndices);
            Index jtI2 = IndividualToJointTypeIndices( 
                    typeIndices2);
            p1 = GetProbability(jtI1);
            p2 = GetProbability(jtI2);

            SetProbability(jtI1, p1+p2);
            SetProbability(jtI2, 0.0);

            // if are doing approximate clustering, also update the
            // utility by a weighted sum
            if(_m_clusterAlgorithm!=Lossless)
            {
                for(Index jaI=0; jaI < GetNrJointActions(); jaI++)
                {
                    u1 = GetUtility(jtI1,jaI);
                    u2 = GetUtility(jtI2,jaI);

                    // set the weighted utility
                    SetUtility(jtI1, jaI, (p1/(p1+p2))*u1 + (p2/(p1+p2))*u2);
                }
            }
        }        
        finished = 
            IndexTools::Increment(typeIndices, _m_nrTypes);
    }
}